

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode parse_numericrange(UA_String *str,UA_NumericRange *range)

{
  UA_Byte *pUVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  UA_NumericRangeDimension *pUVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  UA_NumericRangeDimension *__ptr;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  UA_StatusCode UVar16;
  
  lVar12 = 0;
  __ptr = (UA_NumericRangeDimension *)0x0;
  uVar15 = 0;
  uVar13 = 0;
  do {
    if (uVar15 <= uVar13) {
      pUVar5 = (UA_NumericRangeDimension *)realloc(__ptr,uVar15 * 8 + 0x10);
      if (pUVar5 == (UA_NumericRangeDimension *)0x0) {
        UVar16 = 0x80030000;
        goto LAB_0011b324;
      }
      uVar15 = uVar15 + 2;
      __ptr = pUVar5;
    }
    pUVar1 = str->data;
    UVar16 = 0x80360000;
    if (pUVar1 == (UA_Byte *)0x0) goto LAB_0011b324;
    uVar2 = str->length;
    uVar6 = uVar2 - lVar12;
    uVar7 = 0xffffffffffffffff;
    uVar4 = 0;
    do {
      uVar11 = uVar4;
      uVar8 = uVar6;
      if ((lVar12 - uVar2) + uVar7 == -1) break;
      lVar9 = uVar7 + lVar12 + 1;
      uVar8 = uVar7 + 1;
      uVar7 = uVar8;
      uVar4 = ((uint)pUVar1[lVar9] + uVar11 * 10) - 0x30;
    } while (0xf5 < (byte)(pUVar1[lVar9] - 0x3a));
    __ptr[uVar13].min = uVar11;
    if (uVar8 == 0) goto LAB_0011b324;
    uVar7 = uVar8 + 1;
    if ((uVar6 < uVar7 || uVar6 - uVar7 == 0) || (pUVar1[uVar8 + lVar12] != ':')) {
      __ptr[uVar13].max = uVar11;
    }
    else {
      lVar9 = -1;
      uVar4 = 0;
      do {
        uVar14 = uVar4;
        lVar10 = uVar6 - uVar7;
        if (((uVar8 + lVar12) - uVar2) + 1 + lVar9 == -1) break;
        lVar3 = lVar9 + uVar7 + lVar12 + 1;
        lVar10 = lVar9 + 1;
        lVar9 = lVar10;
        uVar4 = ((uint)pUVar1[lVar3] + uVar14 * 10) - 0x30;
      } while (0xf5 < (byte)(pUVar1[lVar3] - 0x3a));
      __ptr[uVar13].max = uVar14;
      if (lVar10 == 0) {
        UVar16 = 0x80360000;
        goto LAB_0011b324;
      }
      UVar16 = 0x80360000;
      if ((uVar14 <= uVar11) || (uVar8 = lVar10 + uVar7, uVar8 == 0)) goto LAB_0011b324;
    }
    UVar16 = 0x80360000;
    uVar8 = uVar8 + lVar12;
    uVar13 = uVar13 + 1;
    if (uVar2 <= uVar8) {
      if (uVar13 != 0) {
        range->dimensions = __ptr;
        range->dimensionsSize = uVar13;
        return 0;
      }
      UVar16 = 0;
      goto LAB_0011b324;
    }
    lVar12 = uVar8 + 1;
    if (pUVar1[uVar8] != ',') {
LAB_0011b324:
      free(__ptr);
      return UVar16;
    }
  } while( true );
}

Assistant:

UA_StatusCode
parse_numericrange(const UA_String *str, UA_NumericRange *range) {
    size_t idx = 0;
    size_t dimensionsMax = 0;
    UA_NumericRangeDimension *dimensions = NULL;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    size_t offset = 0;
    while(true) {
        /* alloc dimensions */
        if(idx >= dimensionsMax) {
            UA_NumericRangeDimension *newds;
            size_t newdssize = sizeof(UA_NumericRangeDimension) * (dimensionsMax + 2);
            newds = UA_realloc(dimensions, newdssize);
            if(!newds) {
                retval = UA_STATUSCODE_BADOUTOFMEMORY;
                break;
            }
            dimensions = newds;
            dimensionsMax = dimensionsMax + 2;
        }

        /* read the dimension */
        size_t progress = readDimension(&str->data[offset], str->length - offset,
                                        &dimensions[idx]);
        if(progress == 0) {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        offset += progress;
        ++idx;

        /* loop into the next dimension */
        if(offset >= str->length)
            break;

        if(str->data[offset] != ',') {
            retval = UA_STATUSCODE_BADINDEXRANGEINVALID;
            break;
        }
        ++offset;
    }

    if(retval == UA_STATUSCODE_GOOD && idx > 0) {
        range->dimensions = dimensions;
        range->dimensionsSize = idx;
    } else
        UA_free(dimensions);

    return retval;
}